

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlacon2.c
# Opt level: O3

int zlacon2_(int *n,doublecomplex *v,doublecomplex *x,double *est,int *kase,int *isave)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  doublecomplex *pdVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  int c__1;
  int local_44;
  double local_40;
  double local_38;
  
  local_44 = 1;
  local_40 = dmach("Safe minimum");
  if (*kase == 0) {
    iVar4 = *n;
    if (0 < (long)iVar4) {
      lVar7 = 0;
      do {
        *(double *)((long)&x->r + lVar7) = 1.0 / (double)iVar4;
        *(undefined8 *)((long)&x->i + lVar7) = 0;
        lVar7 = lVar7 + 0x10;
      } while ((long)iVar4 * 0x10 != lVar7);
    }
    iVar4 = 1;
LAB_00111151:
    *kase = iVar4;
    *isave = iVar4;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar3 = izmax1_slu(n,x,&local_44);
    iVar3 = iVar3 + -1;
    isave[1] = iVar3;
    isave[2] = 2;
    goto LAB_001111b6;
  case 3:
    zcopy_(n,x,&local_44,v,&local_44);
    local_38 = *est;
    dVar11 = dzsum1_slu(n,v,&local_44);
    *est = dVar11;
    if (local_38 < dVar11) {
      if (0 < *n) {
        lVar7 = 0;
        do {
          dVar11 = z_abs(x);
          if (dVar11 <= local_40) {
            x->r = 1.0;
            x->i = 0.0;
          }
          else {
            x->r = (1.0 / dVar11) * x->r;
            x->i = (1.0 / dVar11) * x->i;
          }
          lVar7 = lVar7 + 1;
          x = x + 1;
        } while (lVar7 < *n);
      }
      *kase = 2;
      *isave = 4;
      return 0;
    }
LAB_00111307:
    uVar1 = *n;
    if (0 < (int)uVar1) {
      pdVar8 = &x->i;
      uVar6 = 0;
      dVar11 = 1.0;
      do {
        ((doublecomplex *)(pdVar8 + -1))->r =
             ((double)(int)uVar6 / (double)(int)(uVar1 - 1) + 1.0) * dVar11;
        *pdVar8 = 0.0;
        dVar11 = -dVar11;
        uVar6 = uVar6 + 1;
        pdVar8 = pdVar8 + 2;
      } while (uVar1 != uVar6);
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar4 = isave[1];
    iVar2 = izmax1_slu(n,x,&local_44);
    iVar3 = iVar2 + -1;
    isave[1] = iVar3;
    if (((x[iVar4].r == ABS(x[(long)iVar2 + -1].r)) &&
        (!NAN(x[iVar4].r) && !NAN(ABS(x[(long)iVar2 + -1].r)))) || (4 < isave[2]))
    goto LAB_00111307;
    isave[2] = isave[2] + 1;
LAB_001111b6:
    if (0 < *n) {
      lVar7 = 0;
      pdVar5 = x;
      do {
        pdVar5->r = 0.0;
        pdVar5->i = 0.0;
        lVar7 = lVar7 + 1;
        pdVar5 = pdVar5 + 1;
      } while (lVar7 < *n);
      iVar3 = isave[1];
    }
    x[iVar3].r = 1.0;
    x[iVar3].i = 0.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    local_40 = dzsum1_slu(n,x,&local_44);
    local_40 = local_40 / (double)(*n * 3);
    local_40 = local_40 + local_40;
    if (local_40 < *est || local_40 == *est) goto LAB_00111391;
    zcopy_(n,x,&local_44,v,&local_44);
    uVar9 = SUB84(local_40,0);
    uVar10 = (undefined4)((ulong)local_40 >> 0x20);
    break;
  default:
    if (*n != 1) {
      dVar11 = dzsum1_slu(n,x,&local_44);
      *est = dVar11;
      if (0 < *n) {
        lVar7 = 0;
        do {
          dVar11 = z_abs(x);
          if (dVar11 <= local_40) {
            x->r = 1.0;
            x->i = 0.0;
          }
          else {
            x->r = (1.0 / dVar11) * x->r;
            x->i = (1.0 / dVar11) * x->i;
          }
          lVar7 = lVar7 + 1;
          x = x + 1;
        } while (lVar7 < *n);
      }
      iVar4 = 2;
      goto LAB_00111151;
    }
    dVar11 = x->i;
    v->r = x->r;
    v->i = dVar11;
    dVar11 = z_abs(v);
    uVar9 = SUB84(dVar11,0);
    uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
  }
  *est = (double)CONCAT44(uVar10,uVar9);
LAB_00111391:
  *kase = 0;
  return 0;
}

Assistant:

int
zlacon2_(int *n, doublecomplex *v, doublecomplex *x, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};

    /* System generated locals */
    double d__1;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
    double safmin;
    extern double dmach(char *);
    extern int izmax1_slu(int *, doublecomplex *, int *);
    extern double dzsum1_slu(int *, doublecomplex *, int *);
    extern void zcopy_(int *, doublecomplex *, int *, doublecomplex *, int *);

    safmin = dmach("Safe minimum");
    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i].r = 1. / (double) (*n);
	    x[i].i = 0.;
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = z_abs(&v[0]);
	/*        ... QUIT */
	goto L150;
    }
    *est = dzsum1_slu(n, x, &c__1);

    for (i = 0; i < *n; ++i) {
	d__1 = z_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
    isave[1] = izmax1_slu(n, &x[0], &c__1);  /* j */
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    CCOPY(n, x, &c__1, v, &c__1);
#else
    zcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
    *est = dzsum1_slu(n, v, &c__1);


L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	d__1 = z_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
    isave[1] = izmax1_slu(n, &x[0], &c__1); /* j */
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast].r != (d__1 = x[isave[1]].r, fabs(d__1)) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1].r = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	x[i-1].i = 0.;
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
    temp = dzsum1_slu(n, x, &c__1) / (double)(*n * 3) * 2.;
    if (temp > *est) {
#ifdef _CRAY
	CCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	zcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}